

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall hdc::Lex::isOperator(Lex *this)

{
  char cVar1;
  char *pcVar2;
  bool local_12;
  char c;
  Lex *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->buffer);
  cVar1 = *pcVar2;
  local_12 = true;
  if ((((((((cVar1 != '(') && (local_12 = true, cVar1 != ')')) && (local_12 = true, cVar1 != '['))
         && (((local_12 = true, cVar1 != ']' && (local_12 = true, cVar1 != '{')) &&
             ((local_12 = true, cVar1 != '}' &&
              ((local_12 = true, cVar1 != '+' && (local_12 = true, cVar1 != '-')))))))) &&
        (local_12 = true, cVar1 != '*')) &&
       (((((local_12 = true, cVar1 != '/' && (local_12 = true, cVar1 != '%')) &&
          (local_12 = true, cVar1 != '!')) &&
         ((local_12 = true, cVar1 != '&' && (local_12 = true, cVar1 != '|')))) &&
        ((local_12 = true, cVar1 != '~' &&
         ((local_12 = true, cVar1 != '=' && (local_12 = true, cVar1 != '>')))))))) &&
      ((local_12 = true, cVar1 != '<' &&
       (((local_12 = true, cVar1 != '^' && (local_12 = true, cVar1 != '.')) &&
        (local_12 = true, cVar1 != '$')))))) &&
     (((local_12 = true, cVar1 != ':' && (local_12 = true, cVar1 != '?')) &&
      ((local_12 = true, cVar1 != '@' && (local_12 = true, cVar1 != ',')))))) {
    local_12 = cVar1 == ';';
  }
  return local_12;
}

Assistant:

bool Lex::isOperator() {
    char c = buffer[idx];

    return c == '(' || c == ')' || c == '[' || c == ']'
        || c == '{' || c == '}' || c == '+' || c == '-'
        || c == '*' || c == '/' || c == '%' || c == '!'
        || c == '&' || c == '|' || c == '~' || c ==  '='
        || c == '>' || c == '<' || c == '^' || c == '.'
        || c == '$' || c == ':' || c == '?' || c == '@'
        || c == ',' || c == ';'; 
}